

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::RandomUniformCase::test
          (RandomUniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  bool bVar1;
  bool bVar2;
  deUint32 programGL_00;
  UniformCollection *this_00;
  TestLog *log_00;
  bool local_31b;
  bool local_31a;
  bool local_319;
  byte local_30b;
  allocator<char> local_309;
  undefined1 local_308 [6];
  bool success_5;
  allocator<char> local_2e1;
  string local_2e0;
  ScopedLogSection local_2c0;
  ScopedLogSection section_6;
  undefined1 local_2b0 [6];
  bool success_4;
  allocator<char> local_289;
  string local_288;
  ScopedLogSection local_268;
  ScopedLogSection section_5;
  undefined1 local_258 [6];
  bool success_3;
  allocator<char> local_231;
  string local_230;
  ScopedLogSection local_210;
  ScopedLogSection section_4;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  ScopedLogSection local_1b8;
  ScopedLogSection section_3;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  uniformValues;
  undefined1 local_190 [6];
  bool success_2;
  allocator<char> local_169;
  string local_168;
  ScopedLogSection local_148;
  ScopedLogSection section_2;
  undefined1 local_138 [6];
  bool success_1;
  allocator<char> local_111;
  string local_110;
  ScopedLogSection local_f0;
  ScopedLogSection section_1;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  uniformDefaultValues;
  undefined1 local_c8 [6];
  bool success;
  allocator<char> local_91;
  string local_90;
  ScopedLogSection local_70;
  ScopedLogSection section;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniform;
  TestLog *log;
  deUint32 programGL;
  bool performRenderTest;
  bool performCompareUniformValues;
  bool performAssignUniforms;
  bool performCheckUniformDefaultValues;
  bool performGetUniforms;
  bool performGetActiveUniforms;
  bool renderingPossible;
  Random *rnd_local;
  ShaderProgram *program_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  *basicUniformReportsRef_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  RandomUniformCase *this_local;
  
  local_30b = 1;
  if ((*(uint *)&(this->super_UniformCase).super_CallLogWrapper.field_0x14 & 0x40) != 0) {
    this_00 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
              ::operator->(&(this->super_UniformCase).m_uniformCollection);
    bVar1 = anon_unknown_1::UniformCollection::containsSeveralSamplerTypes(this_00);
    local_30b = bVar1 ^ 0xff;
  }
  programGL._2_1_ = de::Random::getBool(rnd);
  bVar1 = de::Random::getBool(rnd);
  local_319 = false;
  if (bVar1) {
    local_319 = de::Random::getBool(rnd);
  }
  bVar2 = de::Random::getBool(rnd);
  local_31a = false;
  if ((bVar1) && (local_31a = false, bVar2)) {
    local_31a = de::Random::getBool(rnd);
  }
  local_31b = false;
  if (((local_30b & 1) != 0) && (local_31b = false, bVar2)) {
    local_31b = de::Random::getBool(rnd);
  }
  programGL_00 = glu::ShaderProgram::getProgram(program);
  log_00 = tcu::TestContext::getLog
                     ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  if ((((!programGL._2_1_) && (!bVar1)) && (local_319 == false)) &&
     (((!bVar2 && (local_31a == false)) && (local_31b == false)))) {
    programGL._2_1_ = true;
  }
  if (programGL._2_1_ != false) {
    std::
    vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
    ::vector((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
              *)&section);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"InfoGetActiveUniform",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,"Uniform information queries with glGetActiveUniform()",
               (allocator<char> *)
               ((long)&uniformDefaultValues.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_70,log_00,&local_90,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uniformDefaultValues.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
         UniformCase::getActiveUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                     *)&section,basicUniformReportsRef,programGL_00);
    if (!(bool)uniformDefaultValues.
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_) {
      this_local._7_1_ = 0;
    }
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
         !(bool)uniformDefaultValues.
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_70);
    if ((uint)uniformDefaultValues.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    std::
    vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
    ::~vector((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
               *)&section);
    if ((uint)uniformDefaultValues.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_019d0075;
  }
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ::vector((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
            *)&section_1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"GetUniformDefaults",&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"Uniform default value query",
               (allocator<char> *)((long)&section_2.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_f0,log_00,&local_110,(string *)local_138);
    std::__cxx11::string::~string((string *)local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    section_2.m_log._6_1_ =
         UniformCase::getUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                     *)&section_1,basicUniforms,programGL_00);
    if (!(bool)section_2.m_log._6_1_) {
      this_local._7_1_ = 0;
    }
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !(bool)section_2.m_log._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
    if ((uint)uniformDefaultValues.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_019cf741;
  }
  else {
LAB_019cf741:
    if (local_319 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"DefaultValueCheck",&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_190,"Verify that the uniforms have correct initial values (zeros)",
                 (allocator<char> *)
                 ((long)&uniformValues.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_148,log_00,&local_168,(string *)local_190);
      std::__cxx11::string::~string((string *)local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&uniformValues.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      uniformValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
           UniformCase::checkUniformDefaultValues
                     (&this->super_UniformCase,
                      (vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       *)&section_1,basicUniforms);
      if (!(bool)uniformValues.
                 super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_) {
        this_local._7_1_ = 0;
      }
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
           !(bool)uniformValues.
                  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_148);
      if ((uint)uniformDefaultValues.
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_019cf91a;
    }
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
LAB_019cf91a:
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
             *)&section_1);
  if ((uint)uniformDefaultValues.
            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_019d0075;
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ::vector((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
            *)&section_3);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"UniformAssign",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"Uniform value assignments",
               (allocator<char> *)((long)&section_4.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_1b8,log_00,&local_1d8,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_4.m_log + 7));
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    UniformCase::assignUniforms(&this->super_UniformCase,basicUniforms,programGL_00,rnd);
    tcu::ScopedLogSection::~ScopedLogSection(&local_1b8);
  }
  if (local_31a == false) {
LAB_019cfe6f:
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"GetUniforms",&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_258,"Uniform value query",
               (allocator<char> *)((long)&section_5.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_210,log_00,&local_230,(string *)local_258);
    std::__cxx11::string::~string((string *)local_258);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_5.m_log + 7));
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    section_5.m_log._6_1_ =
         UniformCase::getUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                     *)&section_3,basicUniforms,programGL_00);
    if (!(bool)section_5.m_log._6_1_) {
      this_local._7_1_ = 0;
    }
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
    uniformDefaultValues.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !(bool)section_5.m_log._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_210);
    if ((uint)uniformDefaultValues.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,"ValueCheck",&local_289);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2b0,"Verify that the reported values match the assigned values",
                 (allocator<char> *)((long)&section_6.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_268,log_00,&local_288,(string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_6.m_log + 7));
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      section_6.m_log._6_1_ =
           UniformCase::compareUniformValues
                     (&this->super_UniformCase,
                      (vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       *)&section_3,basicUniforms);
      if (!(bool)section_6.m_log._6_1_) {
        this_local._7_1_ = 0;
      }
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !(bool)section_6.m_log._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_268);
      if ((uint)uniformDefaultValues.
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_019cfe6f;
    }
  }
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
             *)&section_3);
  if ((uint)uniformDefaultValues.
            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    if (local_31b != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"RenderTest",&local_2e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_308,"Render test",&local_309);
      tcu::ScopedLogSection::ScopedLogSection(&local_2c0,log_00,&local_2e0,(string *)local_308);
      std::__cxx11::string::~string((string *)local_308);
      std::allocator<char>::~allocator(&local_309);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      bVar1 = UniformCase::renderTest(&this->super_UniformCase,basicUniforms,program,rnd);
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      uniformDefaultValues.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar1;
      tcu::ScopedLogSection::~ScopedLogSection(&local_2c0);
      if ((uint)uniformDefaultValues.
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_019d0075;
    }
    this_local._7_1_ = 1;
  }
LAB_019d0075:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RandomUniformCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	// \note Different sampler types may not be bound to same unit when rendering.
	const bool		renderingPossible						= (m_features & FEATURE_UNIFORMVALUE_ZERO) == 0 || !m_uniformCollection->containsSeveralSamplerTypes();

	bool			performGetActiveUniforms			= rnd.getBool();
	const bool		performGetUniforms					= rnd.getBool();
	const bool		performCheckUniformDefaultValues	= performGetUniforms && rnd.getBool();
	const bool		performAssignUniforms				= rnd.getBool();
	const bool		performCompareUniformValues			= performGetUniforms && performAssignUniforms && rnd.getBool();
	const bool		performRenderTest					= renderingPossible && performAssignUniforms && rnd.getBool();
	const deUint32	programGL							= program.getProgram();
	TestLog&		log									= m_testCtx.getLog();

	if (!(performGetActiveUniforms || performGetUniforms || performCheckUniformDefaultValues || performAssignUniforms || performCompareUniformValues || performRenderTest))
		performGetActiveUniforms = true; // Do something at least.

#define PERFORM_AND_CHECK(CALL, SECTION_NAME, SECTION_DESCRIPTION)						\
	do																					\
	{																					\
		const ScopedLogSection section(log, (SECTION_NAME), (SECTION_DESCRIPTION));		\
		const bool success = (CALL);													\
		if (!success)																	\
			return false;																\
	} while (false)

	if (performGetActiveUniforms)
	{
		vector<BasicUniformReportGL> reportsUniform;
		PERFORM_AND_CHECK(getActiveUniforms(reportsUniform, basicUniformReportsRef, programGL), "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
	}

	{
		vector<VarValue> uniformDefaultValues;

		if (performGetUniforms)
			PERFORM_AND_CHECK(getUniforms(uniformDefaultValues, basicUniforms, programGL), "GetUniformDefaults", "Uniform default value query");
		if (performCheckUniformDefaultValues)
			PERFORM_AND_CHECK(checkUniformDefaultValues(uniformDefaultValues, basicUniforms), "DefaultValueCheck", "Verify that the uniforms have correct initial values (zeros)");
	}

	{
		vector<VarValue> uniformValues;

		if (performAssignUniforms)
		{
			const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
			assignUniforms(basicUniforms, programGL, rnd);
		}
		if (performCompareUniformValues)
		{
			PERFORM_AND_CHECK(getUniforms(uniformValues, basicUniforms, programGL), "GetUniforms", "Uniform value query");
			PERFORM_AND_CHECK(compareUniformValues(uniformValues, basicUniforms), "ValueCheck", "Verify that the reported values match the assigned values");
		}
	}

	if (performRenderTest)
		PERFORM_AND_CHECK(renderTest(basicUniforms, program, rnd), "RenderTest", "Render test");

#undef PERFORM_AND_CHECK

	return true;
}